

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O0

LY_ERR lyd_print_(ly_out *out,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  ly_ctx *local_40;
  ly_ctx *local_38;
  LY_ERR local_24;
  LY_ERR ret;
  uint32_t options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  ly_out *out_local;
  
  local_24 = LY_SUCCESS;
  switch(format) {
  case LYD_UNKNOWN:
    if (root == (lyd_node *)0x0) {
      local_40 = (ly_ctx *)0x0;
    }
    else {
      if (root->schema == (lysc_node *)0x0) {
        local_38 = (ly_ctx *)root[2].schema;
      }
      else {
        local_38 = root->schema->module->ctx;
      }
      local_40 = local_38;
    }
    ly_log(local_40,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_data.c",
           0x2a);
    local_24 = LY_EINT;
    break;
  case LYD_XML:
    local_24 = xml_print_data(out,root,options);
    break;
  case LYD_JSON:
    local_24 = json_print_data(out,root,options);
    break;
  case LYD_LYB:
    local_24 = lyb_print_data(out,root,options);
  }
  return local_24;
}

Assistant:

static LY_ERR
lyd_print_(struct ly_out *out, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_ERR ret = LY_SUCCESS;

    switch (format) {
    case LYD_XML:
        ret = xml_print_data(out, root, options);
        break;
    case LYD_JSON:
        ret = json_print_data(out, root, options);
        break;
    case LYD_LYB:
        ret = lyb_print_data(out, root, options);
        break;
    case LYD_UNKNOWN:
        LOGINT(root ? LYD_CTX(root) : NULL);
        ret = LY_EINT;
        break;
    }

    return ret;
}